

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobj.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  long *plVar2;
  Am_Object *pAVar3;
  undefined8 uVar4;
  Am_Value_List *this;
  Am_Wrapper *pAVar5;
  char *__s;
  size_t sVar6;
  ostream *poVar7;
  Am_Object mg_inter_inst;
  Am_Object quit_button;
  Am_Object send_button;
  Am_Object send_cmd;
  Am_Object my_win;
  Am_Object proto_rect;
  Am_Object local_90 [2];
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_String local_30 [8];
  Am_Object local_28;
  
  Am_Initialize();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,argc);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (argc == 2) {
    remote_host = argv[1];
  }
  else {
    remote_host = remote_host_data;
    builtin_strncpy(remote_host_data,"basalt.amulet.cs.cmu.edu",0x19);
  }
  mc = (Am_Connection *)Am_Connection::Open(remote_host);
  Am_Connection::Register_Receiver((Am_Receive_Method *)mc);
  Am_Object::Create((char *)local_90);
  uVar1 = Am_Object::Set((ushort)local_90,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x66,200);
  Am_Object::Am_Object(&local_68,pAVar3);
  Am_Object::~Am_Object(local_90);
  Am_Object::Am_Object(&local_28,&local_68);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,0x67,0x14);
  uVar1 = Am_Object::Set(uVar1,0x66,0x14);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_90);
  uVar4 = Am_Value_List::Add(local_90,100,1,1);
  this = (Am_Value_List *)Am_Value_List::Add(uVar4,0x65,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar3 = (Am_Object *)Am_Object::Add(uVar1,(Am_Wrapper *)0xb8,(ulong)pAVar5);
  Am_Object::Am_Object(&local_60,pAVar3);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_90);
  Am_Object::~Am_Object(&local_70);
  Am_String::Am_String(local_30,"net_rect",true);
  Am_Connection::Register_Prototype(local_30,&local_60);
  Am_String::~Am_String(local_30);
  __s = (char *)Am_Connection::Get_Net_Proto_Name(&local_60);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106118);
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#\n",2);
  Am_Connection::Get_Net_Prototype((char *)local_90);
  poVar7 = (ostream *)operator<<((ostream *)&std::cout,local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"#\n",2);
  Am_Object::~Am_Object(local_90);
  Am_Object::Create((char *)local_90);
  uVar1 = Am_Object::Set((ushort)local_90,0x65,10);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,100,10);
  Am_Object::operator=(&rectangle,pAVar3);
  Am_Object::~Am_Object(local_90);
  Am_Object::Create((char *)local_90);
  Am_Object::Am_Object(&local_38,local_90);
  Am_Object::Add_Part((Am_Object_Data *)&local_68,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_40,&rectangle);
  Am_Object::Add_Part((Am_Object_Data *)&local_68,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Create((char *)&local_78);
  uVar1 = Am_Object::Set((ushort)&local_78,(char *)0x150,0x103054);
  pAVar3 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)net_obj_method.from_wrapper);
  Am_Object::Am_Object(&local_70,pAVar3);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create((char *)&local_80);
  uVar1 = Am_Object::Set((ushort)&local_80,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  Am_Object::Am_Object(&local_78,pAVar3);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Create((char *)&local_48);
  uVar1 = Am_Object::Set((ushort)&local_48,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x8c);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_Quit_No_Ask_Command);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  Am_Object::Am_Object(&local_80,pAVar3);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,&local_78);
  Am_Object::Add_Part((Am_Object_Data *)&local_68,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&local_80);
  Am_Object::Add_Part((Am_Object_Data *)&local_68,SUB81(&local_58,0),1);
  Am_Object::~Am_Object(&local_58);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(local_90);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_68);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  Am_Initialize();

  cout << argc << endl;
  if (argc != 2) {
    remote_host = remote_host_data;
    sprintf(remote_host, "basalt.amulet.cs.cmu.edu");
  } else
    remote_host = argv[1];

  mc = Am_Connection::Open(remote_host);
  mc->Register_Receiver(test_receive);

  Am_Object my_win = Am_Window.Create("my_win")
                         .Set(Am_LEFT, 20)
                         .Set(Am_TOP, 50)
                         .Set(Am_HEIGHT, 200)
                         .Set(Am_WIDTH, 200);

  Am_Screen.Add_Part(my_win);

  Am_Object proto_rect =
      Am_Rectangle.Create("proto rect")
          .Set(Am_HEIGHT, 20)
          .Set(Am_WIDTH, 20)
          .Add(Am_SLOTS_TO_SAVE, Am_Value_List().Add(Am_LEFT).Add(Am_TOP));

  Am_Connection::Register_Prototype("net_rect", proto_rect);
  cout << Am_Connection::Get_Net_Proto_Name(proto_rect) << "#\n";
  cout << Am_Connection::Get_Net_Prototype("net_rect") << "#\n";

  rectangle = proto_rect.Create("rect_inst").Set(Am_TOP, 10).Set(Am_LEFT, 10);

  Am_Object mg_inter_inst = Am_Move_Grow_Interactor.Create("mover");
  //    .Set(Am_DO_METHOD,edit_update_method);

  my_win.Add_Part(mg_inter_inst);
  my_win.Add_Part(rectangle);

  Am_Object send_cmd = Am_Command.Create("send cmd")
                           .Set(Am_LABEL, "Send Object!")
                           .Set(Am_DO_METHOD, net_obj_method);

  Am_Object send_button = Am_Button.Create("send_button")
                              .Set(Am_LEFT, 20)
                              .Set(Am_TOP, 50)
                              .Set(Am_COMMAND, send_cmd);

  Am_Object quit_button = Am_Button.Create("quit_button")
                              .Set(Am_LEFT, 20)
                              .Set(Am_TOP, 140)
                              .Set(Am_COMMAND, Am_Quit_No_Ask_Command);
  my_win.Add_Part(send_button);
  my_win.Add_Part(quit_button);

  /* ************************************************************ */
  /* End user code                                                */
  /* ************************************************************ */

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}